

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O2

double * r8mat_copy_new(int m,int n,double *a1)

{
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  double *pdVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar2 = 0xffffffffffffffff;
  if (-1 < n * m) {
    uVar2 = (ulong)(uint)(n * m) * 8;
  }
  pdVar1 = (double *)operator_new__(uVar2);
  uVar2 = 0;
  uVar3 = 0;
  if (0 < m) {
    uVar3 = (ulong)(uint)m;
  }
  pdVar4 = pdVar1;
  uVar6 = (ulong)(uint)n;
  if (n < 1) {
    uVar6 = uVar2;
  }
  for (; uVar2 != uVar6; uVar2 = uVar2 + 1) {
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      pdVar4[uVar5] = a1[uVar5];
    }
    a1 = a1 + m;
    pdVar4 = pdVar4 + m;
  }
  return pdVar1;
}

Assistant:

double *r8mat_copy_new ( int m, int n, double a1[] )

//****************************************************************************80
//
//  Purpose:
//
//    R8MAT_COPY_NEW copies one R8MAT to a "new" R8MAT.
//
//  Discussion:
//
//    An R8MAT is a doubly dimensioned array of R8's, which
//    may be stored as a vector in column-major order.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    03 July 2008
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int M, N, the number of rows and columns.
//
//    Input, double A1[M*N], the matrix to be copied.
//
//    Output, double R8MAT_COPY_NEW[M*N], the copy of A1.
//
{
  double *a2;
  int i;
  int j;

  a2 = new double[m*n];

  for ( j = 0; j < n; j++ )
  {
    for ( i = 0; i < m; i++ )
    {
      a2[i+j*m] = a1[i+j*m];
    }
  }
  return a2;
}